

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall Utf8Decode_Good_Test::TestBody(Utf8Decode_Good_Test *this)

{
  initializer_list<char32_t> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  char *message;
  AssertHelper local_f0;
  Message local_e8;
  allocator<char32_t> local_d9;
  char32_t local_d8 [8];
  iterator local_b8;
  size_type local_b0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_a8;
  cpstring local_88;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  allocator<unsigned_char> local_43;
  uchar local_42 [10];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> test;
  Utf8Decode_Good_Test *this_local;
  
  builtin_memcpy(local_42,"κόσμε",10);
  local_38 = local_42;
  local_30 = 10;
  test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_43);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l_00,&local_43);
  std::allocator<unsigned_char>::~allocator(&local_43);
  (anonymous_namespace)::Utf8Decode::decode_good_abi_cxx11_(&local_88,this,(bytes *)local_28);
  builtin_memcpy(local_d8,L"κόσμε",0x14);
  local_b8 = local_d8;
  local_b0 = 5;
  std::allocator<char32_t>::allocator(&local_d9);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::__cxx11::u32string::u32string((u32string *)&local_a8,__l,&local_d9);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_nullptr>
            ((EqHelper *)local_68,"decode_good (std::move (test))",
             "cpstring ({0x03BA, 0x03CC, 0x03C3, 0x03BC, 0x03B5})",&local_88,&local_a8);
  std::__cxx11::u32string::~u32string((u32string *)&local_a8);
  std::allocator<char32_t>::~allocator(&local_d9);
  std::__cxx11::u32string::~u32string((u32string *)&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_utf.cpp"
               ,0x17d,message);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST_F (Utf8Decode, Good) {
    std::vector<std::uint8_t> test{
        0xCE, 0xBA, // GREEK SMALL LETTER KAPPA (U+03BA)
        0xCF, 0x8C, // GREEK SMALL LETTER OMICRON WITH TONOS (U+03CC)
        0xCF, 0x83, // GREEK SMALL LETTER SIGMA (U+03C3)
        0xCE, 0xBC, // GREEK SMALL LETTER MU (U+03BC)
        0xCE, 0xB5, // GREEK SMALL LETTER EPSILON (U+03B5)
    };
    EXPECT_EQ (decode_good (std::move (test)), cpstring ({0x03BA, 0x03CC, 0x03C3, 0x03BC, 0x03B5}));
}